

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_layout_widget_space(nk_rect *bounds,nk_context *ctx,nk_window *win,int modify)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  nk_panel_row_layout_type nVar9;
  nk_panel *pnVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  
  if ((ctx->current == (nk_window *)0x0) ||
     (pnVar10 = ctx->current->layout, pnVar10 == (nk_panel *)0x0)) {
    return;
  }
  iVar8 = (pnVar10->row).columns;
  iVar12 = 1;
  if (1 < iVar8) {
    iVar12 = iVar8;
  }
  fVar13 = (ctx->style).window.spacing.y;
  nVar9 = (pnVar10->row).type;
  fVar17 = 0.0;
  iVar11 = (int)win;
  if (NK_LAYOUT_TEMPLATE < nVar9) {
    fVar14 = 0.0;
    fVar15 = 0.0;
    goto LAB_00129894;
  }
  fVar1 = (ctx->style).window.spacing.x;
  fVar15 = (pnVar10->bounds).w;
  fVar19 = fVar15 - (float)(iVar12 + -1) * fVar1;
  switch(nVar9) {
  case NK_LAYOUT_DYNAMIC_FIXED:
    if (fVar19 <= 1.0) {
      fVar19 = 1.0;
    }
    fVar17 = (float)(pnVar10->row).index;
    fVar14 = (fVar19 / (float)iVar8) * fVar17;
    fVar15 = (fVar14 - (float)(int)fVar14) + fVar19 / (float)iVar8;
    break;
  case NK_LAYOUT_DYNAMIC_ROW:
    fVar18 = (pnVar10->row).item_width;
    fVar14 = (pnVar10->row).item_offset;
    fVar19 = fVar19 * fVar18;
    fVar15 = (fVar14 - (float)(int)fVar14) + fVar19;
    if (iVar11 != 0) {
      (pnVar10->row).item_offset = fVar1 + fVar19 + fVar14;
      (pnVar10->row).filled = (pnVar10->row).filled + fVar18;
      (pnVar10->row).index = 0;
    }
    goto LAB_00129894;
  case NK_LAYOUT_DYNAMIC_FREE:
    uVar2 = pnVar10->at_x;
    uVar5 = pnVar10->at_y;
    uVar3 = (pnVar10->row).item.x;
    uVar6 = (pnVar10->row).item.y;
    fVar13 = (pnVar10->row).height;
    auVar16._4_4_ = 0;
    auVar16._0_4_ = *pnVar10->offset_x;
    auVar16._8_4_ = *pnVar10->offset_y;
    auVar16._12_4_ = 0;
    fVar17 = ((float)uVar3 * fVar15 + (float)uVar2) -
             (float)(SUB168(auVar16 | _DAT_001502a0,0) - (double)DAT_001502a0);
    fVar14 = ((float)uVar6 * fVar13 + (float)uVar5) -
             (float)(SUB168(auVar16 | _DAT_001502a0,8) - DAT_001502a0._8_8_);
    bounds->x = fVar17;
    bounds->y = fVar14;
    uVar4 = (pnVar10->row).item.w;
    uVar7 = (pnVar10->row).item.h;
    bounds->w = (float)uVar4 * fVar15 + (fVar17 - (float)(int)fVar17);
    bounds->h = (float)uVar7 * fVar13 + (fVar14 - (float)(int)fVar14);
    return;
  case NK_LAYOUT_DYNAMIC:
    iVar8 = (pnVar10->row).index;
    fVar18 = (pnVar10->row).ratio[iVar8];
    if (fVar18 < 0.0) {
      fVar18 = (pnVar10->row).item_width;
    }
    fVar17 = fVar1 * (float)iVar8;
    fVar14 = (pnVar10->row).item_offset;
    fVar15 = (fVar14 - (float)(int)fVar14) + fVar19 * fVar18;
    if (iVar11 != 0) {
      (pnVar10->row).item_offset = fVar19 * fVar18 + fVar14;
      (pnVar10->row).filled = (pnVar10->row).filled + fVar18;
    }
    goto LAB_00129894;
  case NK_LAYOUT_STATIC_FIXED:
    fVar15 = (pnVar10->row).item_width;
    fVar17 = (float)(pnVar10->row).index;
    fVar14 = fVar15 * fVar17;
    break;
  case NK_LAYOUT_STATIC_ROW:
    iVar8 = (pnVar10->row).index;
    fVar19 = (pnVar10->row).item_width;
    fVar14 = (pnVar10->row).item_offset;
    goto LAB_001297d3;
  case NK_LAYOUT_STATIC_FREE:
    fVar13 = (pnVar10->row).item.w;
    fVar17 = pnVar10->at_x + (pnVar10->row).item.x;
    bounds->w = fVar13;
    if ((iVar11 != 0) &&
       (fVar13 = fVar13 + fVar17, pnVar10->max_x <= fVar13 && fVar13 != pnVar10->max_x)) {
      pnVar10->max_x = fVar13;
    }
    bounds->x = fVar17 - (float)*pnVar10->offset_x;
    bounds->y = (pnVar10->at_y + (pnVar10->row).item.y) - (float)*pnVar10->offset_y;
    bounds->h = (pnVar10->row).item.h;
    return;
  case NK_LAYOUT_STATIC:
    iVar8 = (pnVar10->row).index;
    fVar19 = (pnVar10->row).ratio[iVar8];
    fVar14 = (pnVar10->row).item_offset;
LAB_001297d3:
    fVar17 = fVar1 * (float)iVar8;
    fVar15 = fVar19;
    if (iVar11 != 0) {
LAB_00129885:
      (pnVar10->row).item_offset = fVar19 + fVar14;
    }
    goto LAB_00129894;
  case NK_LAYOUT_TEMPLATE:
    iVar8 = (pnVar10->row).index;
    fVar14 = (pnVar10->row).item_offset;
    fVar19 = (pnVar10->row).templates[iVar8];
    fVar15 = (fVar14 - (float)(int)fVar14) + fVar19;
    fVar17 = fVar1 * (float)iVar8;
    if (iVar11 == 0) goto LAB_00129894;
    goto LAB_00129885;
  }
  fVar17 = fVar1 * fVar17;
LAB_00129894:
  bounds->w = fVar15;
  bounds->h = (pnVar10->row).height - fVar13;
  bounds->y = pnVar10->at_y - (float)*pnVar10->offset_y;
  fVar17 = fVar14 + pnVar10->at_x + fVar17;
  if ((iVar11 != 0) &&
     (fVar15 = fVar15 + fVar17, pnVar10->max_x <= fVar15 && fVar15 != pnVar10->max_x)) {
    pnVar10->max_x = fVar15;
  }
  bounds->x = fVar17 - (float)*pnVar10->offset_x;
  return;
}

Assistant:

NK_LIB void
nk_layout_widget_space(struct nk_rect *bounds, const struct nk_context *ctx,
struct nk_window *win, int modify)
{
struct nk_panel *layout;
const struct nk_style *style;

struct nk_vec2 spacing;

float item_offset = 0;
float item_width = 0;
float item_spacing = 0;
float panel_space = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
style = &ctx->style;
NK_ASSERT(bounds);

spacing = style->window.spacing;
panel_space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
layout->bounds.w, layout->row.columns);

#define NK_FRAC(x) (x - (int)x) /* will be used to remove fookin gaps */
/* calculate the width of one item inside the current layout space */
switch (layout->row.type) {
case NK_LAYOUT_DYNAMIC_FIXED: {
/* scaling fixed size widgets item width */
float w = NK_MAX(1.0f,panel_space) / (float)layout->row.columns;
item_offset = (float)layout->row.index * w;
item_width = w + NK_FRAC(item_offset);
item_spacing = (float)layout->row.index * spacing.x;
} break;
case NK_LAYOUT_DYNAMIC_ROW: {
/* scaling single ratio widget width */
float w = layout->row.item_width * panel_space;
item_offset = layout->row.item_offset;
item_width = w + NK_FRAC(item_offset);
item_spacing = 0;

if (modify) {
layout->row.item_offset += w + spacing.x;
layout->row.filled += layout->row.item_width;
layout->row.index = 0;
}
} break;
case NK_LAYOUT_DYNAMIC_FREE: {
/* panel width depended free widget placing */
bounds->x = layout->at_x + (layout->bounds.w * layout->row.item.x);
bounds->x -= (float)*layout->offset_x;
bounds->y = layout->at_y + (layout->row.height * layout->row.item.y);
bounds->y -= (float)*layout->offset_y;
bounds->w = layout->bounds.w  * layout->row.item.w + NK_FRAC(bounds->x);
bounds->h = layout->row.height * layout->row.item.h + NK_FRAC(bounds->y);
return;
}
case NK_LAYOUT_DYNAMIC: {
/* scaling arrays of panel width ratios for every widget */
float ratio, w;
NK_ASSERT(layout->row.ratio);
ratio = (layout->row.ratio[layout->row.index] < 0) ?
layout->row.item_width : layout->row.ratio[layout->row.index];

w = (ratio * panel_space);
item_spacing = (float)layout->row.index * spacing.x;
item_offset = layout->row.item_offset;
item_width = w + NK_FRAC(item_offset);

if (modify) {
layout->row.item_offset += w;
layout->row.filled += ratio;
}
} break;
case NK_LAYOUT_STATIC_FIXED: {
/* non-scaling fixed widgets item width */
item_width = layout->row.item_width;
item_offset = (float)layout->row.index * item_width;
item_spacing = (float)layout->row.index * spacing.x;
} break;
case NK_LAYOUT_STATIC_ROW: {
/* scaling single ratio widget width */
item_width = layout->row.item_width;
item_offset = layout->row.item_offset;
item_spacing = (float)layout->row.index * spacing.x;
if (modify) layout->row.item_offset += item_width;
} break;
case NK_LAYOUT_STATIC_FREE: {
/* free widget placing */
bounds->x = layout->at_x + layout->row.item.x;
bounds->w = layout->row.item.w;
if (((bounds->x + bounds->w) > layout->max_x) && modify)
layout->max_x = (bounds->x + bounds->w);
bounds->x -= (float)*layout->offset_x;
bounds->y = layout->at_y + layout->row.item.y;
bounds->y -= (float)*layout->offset_y;
bounds->h = layout->row.item.h;
return;
}
case NK_LAYOUT_STATIC: {
/* non-scaling array of panel pixel width for every widget */
item_spacing = (float)layout->row.index * spacing.x;
item_width = layout->row.ratio[layout->row.index];
item_offset = layout->row.item_offset;
if (modify) layout->row.item_offset += item_width;
} break;
case NK_LAYOUT_TEMPLATE: {
/* stretchy row layout with combined dynamic/static widget width*/
float w;
NK_ASSERT(layout->row.index < layout->row.columns);
NK_ASSERT(layout->row.index < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
w = layout->row.templates[layout->row.index];
item_offset = layout->row.item_offset;
item_width = w + NK_FRAC(item_offset);
item_spacing = (float)layout->row.index * spacing.x;
if (modify) layout->row.item_offset += w;
} break;
#undef NK_FRAC
default: NK_ASSERT(0); break;
};

/* set the bounds of the newly allocated widget */
bounds->w = item_width;
bounds->h = layout->row.height - spacing.y;
bounds->y = layout->at_y - (float)*layout->offset_y;
bounds->x = layout->at_x + item_offset + item_spacing;
if (((bounds->x + bounds->w) > layout->max_x) && modify)
layout->max_x = bounds->x + bounds->w;
bounds->x -= (float)*layout->offset_x;
}